

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int ConnectSSC32x(SSC32 *pSSC32,char *szCfgFilePath)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (addrsSSC32[lVar2] == (void *)0x0) {
      iVar1 = ConnectSSC32(pSSC32,szCfgFilePath);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsSSC32[lVar2] = pSSC32;
      return 0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int ConnectSSC32x(SSC32* pSSC32, char* szCfgFilePath)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsSSC32[id] != NULL)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = ConnectSSC32(pSSC32, szCfgFilePath);
	if (res != EXIT_SUCCESS) return res;

	addrsSSC32[id] = pSSC32;

	return EXIT_SUCCESS;
}